

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_inter_frame_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  undefined8 in_RDX;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  int inter_block;
  MB_MODE_INFO *unaff_retaddr;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  AV1_COMMON *in_stack_00000038;
  aom_reader *in_stack_00000228;
  MB_MODE_INFO *in_stack_00000230;
  DecoderCodingBlock *in_stack_00000238;
  AV1Decoder *in_stack_00000240;
  int local_34;
  aom_reader *r_00;
  int segment_id;
  MACROBLOCKD *xd_00;
  
  segment_id = (int)((ulong)in_RDX >> 0x20);
  r_00 = (aom_reader *)((in_RDI->quant_params).gqmatrix[0xf][2] + 2);
  pMVar1 = *in_RSI->mi;
  local_34 = 1;
  pMVar1->mv[0].as_int = 0;
  pMVar1->mv[1].as_int = 0;
  xd_00 = in_RSI;
  iVar2 = read_inter_segment_id(in_stack_00000038,(MACROBLOCKD *)pbi,dcb._4_4_,r);
  *(ushort *)&pMVar1->field_0xa7 = *(ushort *)&pMVar1->field_0xa7 & 0xfff8 | (byte)iVar2 & 7;
  iVar2 = read_skip_mode(in_RDI,xd_00,segment_id,r_00);
  *(ushort *)&pMVar1->field_0xa7 = *(ushort *)&pMVar1->field_0xa7 & 0xffbf | ((byte)iVar2 & 1) << 6;
  if ((*(ushort *)&pMVar1->field_0xa7 >> 6 & 1) == 0) {
    iVar2 = read_skip_txfm(in_RDI,xd_00,segment_id,r_00);
    pMVar1->skip_txfm = (uint8_t)iVar2;
  }
  else {
    pMVar1->skip_txfm = '\x01';
  }
  if (*(char *)&r_00[299].ec.end == '\0') {
    iVar2 = read_inter_segment_id(in_stack_00000038,(MACROBLOCKD *)pbi,dcb._4_4_,r);
    *(ushort *)&pMVar1->field_0xa7 = *(ushort *)&pMVar1->field_0xa7 & 0xfff8 | (byte)iVar2 & 7;
  }
  read_cdef((AV1_COMMON *)r,(aom_reader *)cm,xd);
  read_delta_q_params((AV1_COMMON *)xd,(MACROBLOCKD *)mbmi,(aom_reader *)unaff_retaddr);
  if ((*(ushort *)&pMVar1->field_0xa7 >> 6 & 1) == 0) {
    local_34 = read_is_inter_block(in_RDI,xd_00,segment_id,r_00);
  }
  pMVar1->current_qindex = in_RSI->current_base_qindex;
  in_RSI->above_txfm_context =
       (TXFM_CONTEXT *)
       (*(long *)(*(long *)&r_00[0x18c].ec.tell_offs + (long)(in_RSI->tile).tile_row * 8) +
       (long)in_RSI->mi_col);
  in_RSI->left_txfm_context = in_RSI->left_txfm_context_buffer + (int)(in_RSI->mi_row & 0x1f);
  if (local_34 == 0) {
    read_intra_block_mode_info
              ((AV1_COMMON *)xd,(MACROBLOCKD *)mbmi,unaff_retaddr,(aom_reader *)in_RDI);
  }
  else {
    read_inter_block_mode_info
              (in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228);
  }
  return;
}

Assistant:

static void read_inter_frame_mode_info(AV1Decoder *const pbi,
                                       DecoderCodingBlock *dcb, aom_reader *r) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int inter_block = 1;

  mbmi->mv[0].as_int = 0;
  mbmi->mv[1].as_int = 0;
  mbmi->segment_id = read_inter_segment_id(cm, xd, 1, r);

  mbmi->skip_mode = read_skip_mode(cm, xd, mbmi->segment_id, r);

  if (mbmi->skip_mode)
    mbmi->skip_txfm = 1;
  else
    mbmi->skip_txfm = read_skip_txfm(cm, xd, mbmi->segment_id, r);

  if (!cm->seg.segid_preskip)
    mbmi->segment_id = read_inter_segment_id(cm, xd, 0, r);

  read_cdef(cm, r, xd);

  read_delta_q_params(cm, xd, r);

  if (!mbmi->skip_mode)
    inter_block = read_is_inter_block(cm, xd, mbmi->segment_id, r);

  mbmi->current_qindex = xd->current_base_qindex;

  xd->above_txfm_context =
      cm->above_contexts.txfm[xd->tile.tile_row] + xd->mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (xd->mi_row & MAX_MIB_MASK);

  if (inter_block)
    read_inter_block_mode_info(pbi, dcb, mbmi, r);
  else
    read_intra_block_mode_info(cm, xd, mbmi, r);
}